

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

bool __thiscall S2Loop::BoundaryApproxEquals(S2Loop *this,S2Loop *b,S1Angle max_error)

{
  bool bVar1;
  S2Point *pSVar2;
  S2Point *pSVar3;
  byte bVar4;
  int i;
  int i_00;
  
  if (this->num_vertices_ == b->num_vertices_) {
    if (this->num_vertices_ == 1) {
      bVar4 = (b->num_vertices_ != 1 | b->origin_inside_) ^ this->origin_inside_ ^ 1;
    }
    else {
      bVar4 = 0 < this->num_vertices_;
      if (0 < this->num_vertices_) {
        i = 0;
        do {
          pSVar2 = vertex(this,i);
          pSVar3 = vertex(b,0);
          bVar1 = S2::ApproxEquals(pSVar2,pSVar3,max_error);
          if (bVar1) {
            if (this->num_vertices_ < 1) break;
            i_00 = 0;
            while( true ) {
              pSVar2 = vertex(this,i + i_00);
              pSVar3 = vertex(b,i_00);
              bVar1 = S2::ApproxEquals(pSVar2,pSVar3,max_error);
              if (!bVar1) break;
              i_00 = i_00 + 1;
              if (this->num_vertices_ <= i_00) goto LAB_00201196;
            }
          }
          i = i + 1;
          bVar4 = i < this->num_vertices_;
        } while (i < this->num_vertices_);
      }
    }
  }
  else {
    bVar4 = 0;
  }
LAB_00201196:
  return (bool)(bVar4 & 1);
}

Assistant:

bool S2Loop::BoundaryApproxEquals(const S2Loop& b, S1Angle max_error) const {
  if (num_vertices() != b.num_vertices()) return false;

  // Special case to handle empty or full loops.  Since they have the same
  // number of vertices, if one loop is empty/full then so is the other.
  if (is_empty_or_full()) return is_empty() == b.is_empty();

  for (int offset = 0; offset < num_vertices(); ++offset) {
    if (S2::ApproxEquals(vertex(offset), b.vertex(0), max_error)) {
      bool success = true;
      for (int i = 0; i < num_vertices(); ++i) {
        if (!S2::ApproxEquals(vertex(i + offset), b.vertex(i), max_error)) {
          success = false;
          break;
        }
      }
      if (success) return true;
      // Otherwise continue looping.  There may be more than one candidate
      // starting offset since vertices are only matched approximately.
    }
  }
  return false;
}